

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_move_val_tag_to_key_tag(Parser *this)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  pcVar1 = (this->m_val_tag).str;
  sVar2 = (this->m_val_tag).len;
  if (pcVar1 != (char *)0x0 && sVar2 != 0) {
    sVar3 = (this->m_state->line_contents).full.len;
    if ((sVar3 != 0) &&
       (pcVar4 = (this->m_state->line_contents).full.str,
       pcVar1 + sVar2 <= pcVar4 + sVar3 && pcVar4 <= pcVar1)) {
      sVar2 = (this->m_val_tag).len;
      (this->m_key_tag).str = (this->m_val_tag).str;
      (this->m_key_tag).len = sVar2;
      this->m_key_tag_indentation = this->m_val_tag_indentation;
      this->m_val_tag_indentation = 0;
      (this->m_val_tag).str = (char *)0x0;
      (this->m_val_tag).len = 0;
    }
  }
  return;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }